

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3tmat_io.c
# Opt level: O3

int s3tmat_read(char *fn,float32 ****out_tmat,uint32 *out_n_tmat,uint32 *out_n_state)

{
  int iVar1;
  int32 iVar2;
  FILE *fp;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  uint32 swap;
  uint32 rd_chksum;
  char *local_48;
  uint32 sv_chksum;
  uint32 tmp;
  uint32 ignore;
  
  rd_chksum = 0;
  fp = s3open(fn,"rb",&swap);
  iVar5 = -1;
  if (fp == (FILE *)0x0) {
    return -1;
  }
  local_48 = fn;
  pcVar3 = s3get_gvn_fattr("version");
  if (pcVar3 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
            ,0x54,"No version attribute for %s\n",local_48);
LAB_00104113:
    exit(1);
  }
  iVar1 = strcmp(pcVar3,"1.0");
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
            ,0x50,"Version mismatch for %s, file ver: %s != reader ver: %s\n",local_48,pcVar3,"1.0")
    ;
    goto LAB_00104113;
  }
  pcVar4 = s3get_gvn_fattr("chksum0");
  iVar2 = bio_fread_3d(out_tmat,4,out_n_tmat,&tmp,out_n_state,fp,swap,&rd_chksum);
  pcVar3 = local_48;
  if (iVar2 < 0) {
LAB_0010409c:
    s3close(fp);
  }
  else {
    if (pcVar4 != (char *)0x0) {
      iVar2 = bio_fread(&sv_chksum,4,1,fp,swap,&ignore);
      if (iVar2 != 1) goto LAB_0010409c;
      if (sv_chksum != rd_chksum) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
                ,0x6f,"Checksum error; read corrupted data.\n");
        goto LAB_00104113;
      }
    }
    s3close(fp);
    iVar5 = 0;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
            ,0x76,"Read %s [%ux%ux%u array]\n",pcVar3,(ulong)*out_n_tmat,(ulong)(*out_n_state - 1),
            (ulong)*out_n_state);
  }
  return iVar5;
}

Assistant:

int
s3tmat_read(const char *fn,
	    float32 ****out_tmat,
	    uint32 *out_n_tmat,
	    uint32 *out_n_state)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 ignore;
    uint32 tmp;
    char *ver;
    char *do_chk;
    FILE *fp;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, TMAT_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, TMAT_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (bio_fread_3d((void ****)out_tmat,
		  sizeof(float32),
		  out_n_tmat,
		  &tmp,
		  out_n_state,
		  fp,
		  swap,
		  &rd_chksum) < 0) {
	s3close(fp);

	return S3_ERROR;
    }

    if (do_chk) {
	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);
	    
	    return S3_ERROR;
	}

	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupted data.\n");
	}
    }

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array]\n",
	   fn, *out_n_tmat, (*out_n_state)-1, *out_n_state);

    return S3_SUCCESS;
}